

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O3

shared_ptr<CommodoreGCRParser::Sector> __thiscall
CommodoreGCRParser::get_next_sector(CommodoreGCRParser *this)

{
  element_type *__s;
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  int max_index_count;
  CommodoreGCRParser *in_RSI;
  size_t c;
  long lVar7;
  shared_ptr<CommodoreGCRParser::Sector> sVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x118);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0058d7f0;
  __s = (element_type *)(p_Var5 + 1);
  memset(__s,0,0x104);
  max_index_count = in_RSI->index_count_ + 2;
  a_Stack_40[0]._M_pi = p_Var5;
  do {
    uVar2 = proceed_to_next_block(in_RSI,max_index_count);
    _Var6._M_pi = extraout_RDX;
    if (uVar2 == 8) {
      uVar2 = get_next_byte(in_RSI);
      uVar3 = get_next_byte(in_RSI);
      __s->sector = (uint8_t)uVar3;
      uVar3 = get_next_byte(in_RSI);
      *(char *)((long)&p_Var5[1]._vptr__Sp_counted_base + 1) = (char)uVar3;
      uVar3 = get_next_byte(in_RSI);
      uVar4 = get_next_byte(in_RSI);
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xff;
      if ((uVar2 & 0xff) ==
          ((uVar4 ^ uVar3) & 0xff ^
          (uint)(*(byte *)((long)&p_Var5[1]._vptr__Sp_counted_base + 1) ^ __s->sector))) {
        while (uVar2 = proceed_to_next_block(in_RSI,max_index_count), uVar2 != 7) {
          _Var6._M_pi = extraout_RDX_00;
          if (max_index_count <= in_RSI->index_count_) goto LAB_0015e6ab;
        }
        lVar7 = 0;
        uVar2 = 0;
        do {
          uVar3 = get_next_byte(in_RSI);
          *(char *)((long)&p_Var5[1]._vptr__Sp_counted_base + lVar7 + 2) = (char)uVar3;
          uVar2 = (uint)(byte)((byte)uVar2 ^
                              *(byte *)((long)&p_Var5[1]._vptr__Sp_counted_base + lVar7 + 2));
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x100);
        uVar3 = get_next_byte(in_RSI);
        _Var6._M_pi = extraout_RDX_01;
        if (uVar3 == uVar2) {
          uVar1._0_1_ = __s->sector;
          uVar1._1_1_ = __s->track;
          in_RSI->sector_cache_[uVar1].
          super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __s;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&in_RSI->sector_cache_[uVar1].
                      super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,a_Stack_40);
          (this->super_Controller).super_Source._vptr_Source = (_func_int **)__s;
          (this->super_Controller).super_Source.observer_ = (Observer *)a_Stack_40[0]._M_pi;
          _Var6._M_pi = extraout_RDX_02;
          goto LAB_0015e6c0;
        }
      }
    }
    if (max_index_count <= in_RSI->index_count_) {
LAB_0015e6ab:
      (this->super_Controller).super_Source._vptr_Source = (_func_int **)0x0;
      (this->super_Controller).super_Source.observer_ = (Observer *)0x0;
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
        _Var6._M_pi = extraout_RDX_03;
      }
LAB_0015e6c0:
      sVar8.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var6._M_pi;
      sVar8.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<CommodoreGCRParser::Sector>)
             sVar8.super___shared_ptr<CommodoreGCRParser::Sector,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

std::shared_ptr<Sector> get_next_sector() {
			auto sector = std::make_shared<Sector>();
			const int max_index_count = index_count_ + 2;

			while(index_count_ < max_index_count) {
				// look for a sector header
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x08) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				// get sector details, skip if this looks malformed
				uint8_t checksum = uint8_t(get_next_byte());
				sector->sector = uint8_t(get_next_byte());
				sector->track = uint8_t(get_next_byte());
				uint8_t disk_id[2];
				disk_id[0] = uint8_t(get_next_byte());
				disk_id[1] = uint8_t(get_next_byte());
				if(checksum != (sector->sector ^ sector->track ^ disk_id[0] ^ disk_id[1])) continue;

				// look for the following data
				while(1) {
					if(proceed_to_next_block(max_index_count) == 0x07) break;
					if(index_count_ >= max_index_count) return nullptr;
				}

				checksum = 0;
				for(std::size_t c = 0; c < 256; c++) {
					sector->data[c] = uint8_t(get_next_byte());
					checksum ^= sector->data[c];
				}

				if(checksum == get_next_byte()) {
					uint16_t sector_address = uint16_t((sector->track << 8) | sector->sector);
					sector_cache_[sector_address] = sector;
					return sector;
				}
			}

			return nullptr;
		}